

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

node * NodeSingleton(anynode *Any,fourcc_t Class)

{
  intptr_t iVar1;
  array *p;
  node *pnVar2;
  fourcc_t Class_local;
  bool_t Found;
  
  if (Any == (anynode *)0x0) {
    pnVar2 = (node *)0x0;
  }
  else {
    p = (array *)(**(long **)((long)Any + 8) + 0x60);
    pnVar2 = (node *)0x0;
    Class_local = Class;
    iVar1 = ArrayFindEx(p,*(ulong *)(**(long **)((long)Any + 8) + 0x68) >> 3,8,&Class_local,
                        CmpNodeClass,(void *)0x0,&Found);
    if (Found != 0) {
      pnVar2 = *(node **)(p->_Begin + iVar1 * 8);
    }
  }
  return pnVar2;
}

Assistant:

node* NodeSingleton(anynode* Any, fourcc_t Class)
{
    node* Node = NULL;
    if (Any)
    {
        nodecontext* p = Node_Context(Any);
        size_t Pos;
        bool_t Found;

        Pos = ArrayFind(&p->NodeSingleton,node*,&Class,CmpNodeClass,NULL,&Found);
        if (Found)
            Node = ARRAYBEGIN(p->NodeSingleton,node*)[Pos];
    }
    return Node;
}